

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts_no_zeroinit.h
# Opt level: O3

void __thiscall
BRTS_XZ<TTA>::PerformLabelingMem
          (BRTS_XZ<TTA> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int *piVar1;
  undefined8 uVar2;
  ushort uVar3;
  uint uVar4;
  uint height;
  uint uVar5;
  Mat1b *pMVar6;
  long lVar7;
  long lVar8;
  pointer puVar9;
  pointer puVar10;
  pointer puVar11;
  pointer piVar12;
  Run *pRVar13;
  uint64_t *puVar14;
  Run *pRVar15;
  ulong uVar16;
  undefined1 (*pauVar17) [16];
  int iVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  double dVar23;
  MemMat<int> img_labels;
  MemMat<unsigned_char> img;
  Size local_2a0;
  undefined4 local_298;
  Mat *local_290;
  undefined8 local_288;
  Mat_<int> local_280;
  undefined1 local_220 [104];
  Mat local_1b8 [16];
  long local_1a8;
  long *local_170;
  MemMat<unsigned_char> local_158;
  Mat local_90 [96];
  
  cv::Mat::Mat(local_90,&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat(&local_158,(Mat_<unsigned_char> *)local_90);
  cv::Mat::~Mat(local_90);
  uVar2 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_2a0.height = (int)uVar2;
  local_2a0.width = (int)((ulong)uVar2 >> 0x20);
  MemMat<int>::MemMat((MemMat<int> *)local_220,&local_2a0,0);
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar4 = *(uint *)&pMVar6->field_0xc;
  height = *(uint *)&pMVar6->field_0x8;
  (this->data_compressed).height = height;
  (this->data_compressed).width = uVar4;
  uVar19 = uVar4 + 0x3f;
  if (-1 < (long)(int)uVar4) {
    uVar19 = uVar4;
  }
  iVar18 = ((int)uVar19 >> 6) + 1;
  (this->data_compressed).data_width = iVar18;
  uVar19 = iVar18 * height;
  uVar16 = 0xffffffffffffffff;
  if (-1 < (int)uVar19) {
    uVar16 = (ulong)uVar19 * 8;
  }
  puVar14 = (uint64_t *)operator_new__(uVar16);
  (this->data_compressed).bits = puVar14;
  InitCompressedDataMem(this,&this->data_compressed,&local_158);
  (this->data_runs).height = height;
  (this->data_runs).width = uVar4;
  pRVar15 = (Run *)operator_new__((ulong)(((uVar4 >> 1) + 2) * height + 1) << 3);
  (this->data_runs).runs = pRVar15;
  uVar2 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  TTA::MemAlloc((((int)((ulong)uVar2 >> 0x20) + 1) / 2) * (((int)uVar2 + 1) / 2) + 1);
  *TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start =
       *TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start + 1;
  *TTA::mem_rtable_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  TTA::length_ = 1;
  FindRunsMem(this,(this->data_compressed).bits,height,(this->data_compressed).data_width,
              (this->data_runs).runs);
  if (0 < (int)height) {
    pRVar15 = (this->data_runs).runs;
    uVar16 = 0;
    do {
      piVar12 = TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar11 = TTA::mem_rtable_.vec_.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar19 = 0;
      pRVar13 = pRVar15;
      do {
        pRVar15 = pRVar13;
        uVar20 = (uint)pRVar15->start_pos;
        if (pRVar15->start_pos == 0xffff) {
          if ((int)uVar19 < (int)uVar4) {
            lVar22 = (long)(int)uVar19;
            lVar7 = *local_170;
            lVar8 = *(long *)local_220._80_8_;
            do {
              piVar1 = (int *)(lVar7 * uVar16 + local_1a8 + lVar22 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar8 * uVar16 + local_220._24_8_ + lVar22 * 4) = 0;
              lVar22 = lVar22 + 1;
              uVar19 = uVar4;
            } while ((int)uVar4 != lVar22);
          }
          pRVar15 = pRVar15 + 1;
        }
        else {
          uVar3 = pRVar15->end_pos;
          uVar5 = pRVar15->label;
          piVar12[(int)uVar5] = piVar12[(int)uVar5] + 1;
          uVar5 = puVar11[(int)uVar5];
          if ((int)uVar19 < (int)uVar20) {
            uVar21 = (ulong)(int)uVar19;
            lVar7 = *local_170;
            lVar8 = *(long *)local_220._80_8_;
            do {
              piVar1 = (int *)(lVar7 * uVar16 + local_1a8 + uVar21 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar8 * uVar16 + local_220._24_8_ + uVar21 * 4) = 0;
              uVar21 = uVar21 + 1;
              uVar19 = uVar20;
            } while (uVar20 != uVar21);
          }
          if ((int)uVar19 < (int)(uint)uVar3) {
            uVar21 = (ulong)(int)uVar19;
            lVar7 = *local_170;
            lVar8 = *(long *)local_220._80_8_;
            do {
              piVar1 = (int *)(lVar7 * uVar16 + local_1a8 + uVar21 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(lVar8 * uVar16 + local_220._24_8_ + uVar21 * 4) = uVar5;
              uVar21 = uVar21 + 1;
            } while (uVar3 != uVar21);
            uVar19 = (uint)uVar3;
          }
        }
        pRVar13 = pRVar15 + 1;
      } while (uVar20 != 0xffff);
      uVar16 = uVar16 + 1;
    } while (uVar16 != height);
  }
  pauVar17 = (undefined1 (*) [16])operator_new(0x20);
  pauVar17[1] = (undefined1  [16])0x0;
  *pauVar17 = (undefined1  [16])0x0;
  puVar9 = (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar10 = (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)pauVar17;
  (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(pauVar17 + 2);
  (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(pauVar17 + 2);
  if (puVar9 != (pointer)0x0) {
    operator_delete(puVar9,(long)puVar10 - (long)puVar9);
  }
  local_288 = 0;
  local_298 = 0x81010004;
  local_290 = &local_158.accesses_.super_Mat;
  cv::sum((_InputArray *)&local_280);
  *(accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start =
       (long)((double)local_280._0_8_ - 9.223372036854776e+18) &
       (long)(double)local_280._0_8_ >> 0x3f | (long)(double)local_280._0_8_;
  local_288 = 0;
  local_298 = 0x81010004;
  local_290 = local_1b8;
  cv::sum((_InputArray *)&local_280);
  (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[1] =
       (long)(double)local_280._0_8_ >> 0x3f &
       (long)((double)local_280._0_8_ - 9.223372036854776e+18) | (long)(double)local_280._0_8_;
  dVar23 = TTA::MemTotalAccesses();
  (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[2] =
       (long)dVar23 >> 0x3f & (long)(dVar23 - 9.223372036854776e+18) | (long)dVar23;
  MemMat<int>::GetImage(&local_280,(MemMat<int> *)local_220);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     &local_280.super_Mat);
  cv::Mat::~Mat(&local_280.super_Mat);
  pRVar15 = (this->data_runs).runs;
  if (pRVar15 != (Run *)0x0) {
    operator_delete__(pRVar15);
  }
  puVar14 = (this->data_compressed).bits;
  if (puVar14 != (uint64_t *)0x0) {
    operator_delete__(puVar14);
  }
  cv::Mat::~Mat(local_1b8);
  cv::Mat::~Mat((Mat *)(local_220 + 8));
  cv::Mat::~Mat(&local_158.accesses_.super_Mat);
  cv::Mat::~Mat(&local_158.img_.super_Mat);
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses) {
        //Data structure for memory test
        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0);

        int w(img_.cols);
        int h(img_.rows);

        data_compressed.Alloc(h, w);
        InitCompressedDataMem(data_compressed, img);

        //find runs
        data_runs.Alloc(h, w);
        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::MemSetup();
        FindRunsMem(data_compressed.bits, h, data_compressed.data_width, data_runs.runs);

        Run* runs = data_runs.runs;
        for (int i = 0; i < h; i++) {
            for (int j = 0;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    for (; j < w; j++) img_labels(i, j) = 0;
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::MemGetLabel(runs->label);
                for (; j < start_pos; j++) img_labels(i, j) = 0;
                for (; j < end_pos; j++) img_labels(i, j) = label;
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage();

        LabelsSolver::MemDealloc();
        data_runs.Dealloc();
        data_compressed.Dealloc();
    }